

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O3

REF_STATUS ref_fixture_pri_tet_cap_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  ulong uVar10;
  int iVar11;
  REF_INT RVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  char *pcVar16;
  int iVar17;
  REF_INT cell;
  REF_INT local [27];
  REF_INT local_9c;
  int local_98;
  int local_94;
  int local_90;
  REF_INT local_8c;
  REF_INT local_88;
  int local_84 [23];
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 != 0) {
    uVar10 = (ulong)uVar4;
    pcVar16 = "create";
    uVar9 = 0x28a;
    goto LAB_00123903;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar11 = 0;
  iVar5 = (int)(6 / (long)iVar6);
  iVar14 = iVar5 * iVar6;
  if (6 < iVar14) {
    iVar11 = ((((iVar6 + 6) / iVar6) * (iVar14 + -7)) / iVar5 - iVar14) + 7;
  }
  if (iVar7 == iVar11) {
LAB_00122692:
    uVar4 = ref_node_add(ref_node,0,&local_98);
    if (uVar4 != 0) {
      uVar10 = (ulong)uVar4;
      pcVar16 = "add node";
      uVar9 = 0x2a0;
      goto LAB_00123903;
    }
    pRVar2 = ref_node->real;
    lVar15 = (long)local_98;
    pRVar3 = pRVar2 + lVar15 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar15 * 0xf + 2] = 0.0;
    lVar13 = -1;
    if (((-1 < lVar15) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar15])) {
      lVar13 = ref_node->global[lVar15];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar13 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar13 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar13 = -1;
        if (-1 < ref_node->global[lVar15]) {
          lVar13 = ref_node->global[lVar15];
        }
      }
      RVar12 = (REF_INT)(lVar13 / (long)iVar7);
    }
    else {
      lVar13 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar13 = -1;
        if (-1 < ref_node->global[lVar15]) {
          lVar13 = ref_node->global[lVar15];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar12 = iVar6 + (int)((lVar13 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar15] = RVar12;
    uVar4 = ref_node_add(ref_node,1,&local_94);
    if (uVar4 != 0) {
      uVar10 = (ulong)uVar4;
      pcVar16 = "add node";
      uVar9 = 0x2a1;
      goto LAB_00123903;
    }
    pRVar3 = ref_node->real;
    lVar15 = (long)local_94;
    pRVar3[lVar15 * 0xf] = 1.0;
    pRVar3 = pRVar3 + lVar15 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar13 = -1;
    if (((-1 < lVar15) && (local_94 < ref_node->max)) && (-1 < ref_node->global[lVar15])) {
      lVar13 = ref_node->global[lVar15];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar13 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar13 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar13 = -1;
        if (-1 < ref_node->global[lVar15]) {
          lVar13 = ref_node->global[lVar15];
        }
      }
      RVar12 = (REF_INT)(lVar13 / (long)iVar7);
    }
    else {
      lVar13 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar13 = -1;
        if (-1 < ref_node->global[lVar15]) {
          lVar13 = ref_node->global[lVar15];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar12 = iVar6 + (int)((lVar13 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar15] = RVar12;
    uVar4 = ref_node_add(ref_node,2,&local_90);
    if (uVar4 != 0) {
      uVar10 = (ulong)uVar4;
      pcVar16 = "add node";
      uVar9 = 0x2a2;
      goto LAB_00123903;
    }
    pRVar2 = ref_node->real;
    lVar15 = (long)local_90;
    pRVar3 = pRVar2 + lVar15 * 0xf;
    *(undefined4 *)pRVar3 = 0;
    *(undefined4 *)((long)pRVar3 + 4) = 0;
    *(undefined4 *)(pRVar3 + 1) = 0;
    *(undefined4 *)((long)pRVar3 + 0xc) = 0x3ff00000;
    pRVar2[lVar15 * 0xf + 2] = 0.0;
    lVar13 = -1;
    if (((-1 < lVar15) && (local_90 < ref_node->max)) && (-1 < ref_node->global[lVar15])) {
      lVar13 = ref_node->global[lVar15];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar13 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar13 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar13 = -1;
        if (-1 < ref_node->global[lVar15]) {
          lVar13 = ref_node->global[lVar15];
        }
      }
      RVar12 = (REF_INT)(lVar13 / (long)iVar7);
    }
    else {
      lVar13 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar13 = -1;
        if (-1 < ref_node->global[lVar15]) {
          lVar13 = ref_node->global[lVar15];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar12 = iVar6 + (int)((lVar13 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar15] = RVar12;
    uVar4 = ref_node_add(ref_node,3,&local_8c);
    if (uVar4 != 0) {
      uVar10 = (ulong)uVar4;
      pcVar16 = "add node";
      uVar9 = 0x2a3;
      goto LAB_00123903;
    }
    pRVar2 = ref_node->real;
    lVar15 = (long)local_8c;
    pRVar3 = pRVar2 + lVar15 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar15 * 0xf + 2] = 1.0;
    lVar13 = -1;
    if (((-1 < lVar15) && (local_8c < ref_node->max)) && (-1 < ref_node->global[lVar15])) {
      lVar13 = ref_node->global[lVar15];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar13 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar13 = -1;
      if ((-1 < local_8c) && (local_8c < ref_node->max)) {
        lVar13 = -1;
        if (-1 < ref_node->global[lVar15]) {
          lVar13 = ref_node->global[lVar15];
        }
      }
      RVar12 = (REF_INT)(lVar13 / (long)iVar7);
    }
    else {
      lVar13 = -1;
      if ((-1 < local_8c) && (local_8c < ref_node->max)) {
        lVar13 = -1;
        if (-1 < ref_node->global[lVar15]) {
          lVar13 = ref_node->global[lVar15];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar12 = iVar6 + (int)((lVar13 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar15] = RVar12;
    uVar4 = ref_node_add(ref_node,4,&local_88);
    if (uVar4 != 0) {
      uVar10 = (ulong)uVar4;
      pcVar16 = "add node";
      uVar9 = 0x2a4;
      goto LAB_00123903;
    }
    pRVar2 = ref_node->real;
    lVar15 = (long)local_88;
    pRVar3 = pRVar2 + lVar15 * 0xf;
    *pRVar3 = 1.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar15 * 0xf + 2] = 1.0;
    lVar13 = -1;
    if (((-1 < lVar15) && (local_88 < ref_node->max)) && (-1 < ref_node->global[lVar15])) {
      lVar13 = ref_node->global[lVar15];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar13 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar13 = -1;
      if ((-1 < local_88) && (local_88 < ref_node->max)) {
        lVar13 = -1;
        if (-1 < ref_node->global[lVar15]) {
          lVar13 = ref_node->global[lVar15];
        }
      }
      RVar12 = (REF_INT)(lVar13 / (long)iVar7);
    }
    else {
      lVar13 = -1;
      if ((-1 < local_88) && (local_88 < ref_node->max)) {
        lVar13 = -1;
        if (-1 < ref_node->global[lVar15]) {
          lVar13 = ref_node->global[lVar15];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar12 = iVar6 + (int)((lVar13 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar15] = RVar12;
    uVar4 = ref_node_add(ref_node,5,local_84);
    if (uVar4 != 0) {
      uVar10 = (ulong)uVar4;
      pcVar16 = "add node";
      uVar9 = 0x2a5;
      goto LAB_00123903;
    }
    pRVar2 = ref_node->real;
    lVar15 = (long)local_84[0];
    pRVar3 = pRVar2 + lVar15 * 0xf;
    *(undefined4 *)pRVar3 = 0;
    *(undefined4 *)((long)pRVar3 + 4) = 0;
    *(undefined4 *)(pRVar3 + 1) = 0;
    *(undefined4 *)((long)pRVar3 + 0xc) = 0x3ff00000;
    pRVar2[lVar15 * 0xf + 2] = 1.0;
    lVar13 = -1;
    if (((-1 < lVar15) && (local_84[0] < ref_node->max)) && (-1 < ref_node->global[lVar15])) {
      lVar13 = ref_node->global[lVar15];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar13 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar13 = -1;
      if ((-1 < local_84[0]) && (local_84[0] < ref_node->max)) {
        lVar13 = -1;
        if (-1 < ref_node->global[lVar15]) {
          lVar13 = ref_node->global[lVar15];
        }
      }
      RVar12 = (REF_INT)(lVar13 / (long)iVar7);
    }
    else {
      lVar13 = -1;
      if ((-1 < local_84[0]) && (local_84[0] < ref_node->max)) {
        lVar13 = -1;
        if (-1 < ref_node->global[lVar15]) {
          lVar13 = ref_node->global[lVar15];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar12 = iVar6 + (int)((lVar13 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar15] = RVar12;
    uVar4 = ref_cell_add(pRVar1->cell[10],&local_98,&local_9c);
    if (uVar4 != 0) {
      uVar10 = (ulong)uVar4;
      pcVar16 = "add prism";
      uVar9 = 0x2a7;
      goto LAB_00123903;
    }
    iVar11 = ref_mpi->n;
    iVar7 = ref_mpi->id;
    iVar6 = (iVar11 + 6) / iVar11;
    iVar5 = (int)(6 / (long)iVar11);
    iVar14 = 7 - iVar5 * iVar11;
  }
  else {
    iVar6 = (iVar6 + 6) / iVar6;
    iVar11 = 0;
    if (iVar6 + 1U < 3) {
      iVar11 = iVar6;
    }
    iVar14 = 7 - iVar14;
    if (iVar14 <= iVar11) {
      iVar11 = (1 - iVar6 * iVar14) / iVar5 + iVar14;
    }
    if (iVar7 == iVar11) goto LAB_00122692;
    iVar11 = (int)(2 / (long)iVar6);
    if (iVar14 <= iVar11) {
      iVar11 = (2 - iVar6 * iVar14) / iVar5 + iVar14;
    }
    if (iVar7 == iVar11) goto LAB_00122692;
    iVar11 = (int)(3 / (long)iVar6);
    if (iVar14 <= iVar11) {
      iVar11 = (3 - iVar6 * iVar14) / iVar5 + iVar14;
    }
    if (iVar7 == iVar11) goto LAB_00122692;
    iVar11 = (int)(4 / (long)iVar6);
    if (iVar14 <= iVar11) {
      iVar11 = (4 - iVar6 * iVar14) / iVar5 + iVar14;
    }
    if (iVar7 == iVar11) goto LAB_00122692;
    iVar11 = (int)(5 / (long)iVar6);
    if (iVar14 <= iVar11) {
      iVar11 = (5 - iVar6 * iVar14) / iVar5 + iVar14;
    }
    if (iVar7 == iVar11) goto LAB_00122692;
  }
  iVar11 = (int)(3 / (long)iVar6);
  if (iVar14 <= iVar11) {
    iVar11 = (3 - iVar14 * iVar6) / iVar5 + iVar14;
  }
  if (iVar7 == iVar11) {
LAB_00122e8d:
    uVar4 = ref_node_add(ref_node,3,&local_98);
    if (uVar4 != 0) {
      uVar10 = (ulong)uVar4;
      pcVar16 = "add node";
      uVar9 = 0x2b6;
      goto LAB_00123903;
    }
    pRVar2 = ref_node->real;
    lVar15 = (long)local_98;
    pRVar3 = pRVar2 + lVar15 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar15 * 0xf + 2] = 1.0;
    lVar13 = -1;
    if (((-1 < lVar15) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar15])) {
      lVar13 = ref_node->global[lVar15];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar13 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar13 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar13 = -1;
        if (-1 < ref_node->global[lVar15]) {
          lVar13 = ref_node->global[lVar15];
        }
      }
      RVar12 = (REF_INT)(lVar13 / (long)iVar7);
    }
    else {
      lVar13 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar13 = -1;
        if (-1 < ref_node->global[lVar15]) {
          lVar13 = ref_node->global[lVar15];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar12 = iVar6 + (int)((lVar13 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar15] = RVar12;
    uVar4 = ref_node_add(ref_node,4,&local_94);
    if (uVar4 != 0) {
      uVar10 = (ulong)uVar4;
      pcVar16 = "add node";
      uVar9 = 0x2b7;
      goto LAB_00123903;
    }
    pRVar2 = ref_node->real;
    lVar15 = (long)local_94;
    pRVar3 = pRVar2 + lVar15 * 0xf;
    *pRVar3 = 1.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar15 * 0xf + 2] = 1.0;
    lVar13 = -1;
    if (((-1 < lVar15) && (local_94 < ref_node->max)) && (-1 < ref_node->global[lVar15])) {
      lVar13 = ref_node->global[lVar15];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar13 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar13 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar13 = -1;
        if (-1 < ref_node->global[lVar15]) {
          lVar13 = ref_node->global[lVar15];
        }
      }
      RVar12 = (REF_INT)(lVar13 / (long)iVar7);
    }
    else {
      lVar13 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar13 = -1;
        if (-1 < ref_node->global[lVar15]) {
          lVar13 = ref_node->global[lVar15];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar12 = iVar6 + (int)((lVar13 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar15] = RVar12;
    uVar4 = ref_node_add(ref_node,5,&local_90);
    if (uVar4 != 0) {
      uVar10 = (ulong)uVar4;
      pcVar16 = "add node";
      uVar9 = 0x2b8;
      goto LAB_00123903;
    }
    pRVar2 = ref_node->real;
    lVar15 = (long)local_90;
    pRVar3 = pRVar2 + lVar15 * 0xf;
    *(undefined4 *)pRVar3 = 0;
    *(undefined4 *)((long)pRVar3 + 4) = 0;
    *(undefined4 *)(pRVar3 + 1) = 0;
    *(undefined4 *)((long)pRVar3 + 0xc) = 0x3ff00000;
    pRVar2[lVar15 * 0xf + 2] = 1.0;
    lVar13 = -1;
    if (((-1 < lVar15) && (local_90 < ref_node->max)) && (-1 < ref_node->global[lVar15])) {
      lVar13 = ref_node->global[lVar15];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar13 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar13 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar13 = -1;
        if (-1 < ref_node->global[lVar15]) {
          lVar13 = ref_node->global[lVar15];
        }
      }
      RVar12 = (REF_INT)(lVar13 / (long)iVar7);
    }
    else {
      lVar13 = -1;
      if ((-1 < local_90) && (local_90 < ref_node->max)) {
        lVar13 = -1;
        if (-1 < ref_node->global[lVar15]) {
          lVar13 = ref_node->global[lVar15];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar12 = iVar6 + (int)((lVar13 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar15] = RVar12;
    uVar4 = ref_node_add(ref_node,6,&local_8c);
    if (uVar4 != 0) {
      uVar10 = (ulong)uVar4;
      pcVar16 = "add node";
      uVar9 = 0x2b9;
      goto LAB_00123903;
    }
    pRVar2 = ref_node->real;
    lVar15 = (long)local_8c;
    pRVar3 = pRVar2 + lVar15 * 0xf;
    *pRVar3 = 0.3;
    pRVar3[1] = 0.3;
    pRVar2[lVar15 * 0xf + 2] = 2.0;
    lVar13 = -1;
    if (((-1 < lVar15) && (local_8c < ref_node->max)) && (-1 < ref_node->global[lVar15])) {
      lVar13 = ref_node->global[lVar15];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 6) / iVar6;
    if (lVar13 / (long)iVar7 < (long)(ulong)((int)(6 % (long)iVar6) + 1)) {
      lVar13 = -1;
      if ((-1 < local_8c) && (local_8c < ref_node->max)) {
        lVar13 = -1;
        if (-1 < ref_node->global[lVar15]) {
          lVar13 = ref_node->global[lVar15];
        }
      }
      RVar12 = (REF_INT)(lVar13 / (long)iVar7);
    }
    else {
      lVar13 = -1;
      if ((-1 < local_8c) && (local_8c < ref_node->max)) {
        lVar13 = -1;
        if (-1 < ref_node->global[lVar15]) {
          lVar13 = ref_node->global[lVar15];
        }
      }
      iVar5 = (int)(6 / (long)iVar6);
      iVar6 = 7 - iVar6 * iVar5;
      RVar12 = iVar6 + (int)((lVar13 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar15] = RVar12;
    uVar4 = ref_cell_add(pRVar1->cell[8],&local_98,&local_9c);
    if (uVar4 != 0) {
      uVar10 = (ulong)uVar4;
      pcVar16 = "add prism";
      uVar9 = 699;
      goto LAB_00123903;
    }
  }
  else {
    iVar11 = (int)(4 / (long)iVar6);
    if (iVar14 <= iVar11) {
      iVar11 = (4 - iVar14 * iVar6) / iVar5 + iVar14;
    }
    if (iVar7 == iVar11) goto LAB_00122e8d;
    iVar11 = (int)(5 / (long)iVar6);
    if (iVar14 <= iVar11) {
      iVar11 = (5 - iVar14 * iVar6) / iVar5 + iVar14;
    }
    if (iVar7 == iVar11) goto LAB_00122e8d;
    iVar11 = (int)(6 / (long)iVar6);
    if (iVar14 <= iVar11) {
      iVar11 = (6 - iVar6 * iVar14) / iVar5 + iVar14;
    }
    if (iVar7 == iVar11) goto LAB_00122e8d;
  }
  uVar4 = ref_node_initialize_n_global(ref_node,7);
  if (uVar4 != 0) {
    uVar10 = (ulong)uVar4;
    pcVar16 = "init glob";
    uVar9 = 0x2be;
    goto LAB_00123903;
  }
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar11 = 0;
  iVar5 = (int)(6 / (long)iVar6);
  iVar14 = iVar5 * iVar6;
  if (6 < iVar14) {
    iVar11 = ((((iVar6 + 6) / iVar6) * (iVar14 + -7)) / iVar5 - iVar14) + 7;
  }
  if (iVar7 == iVar11) {
LAB_00123489:
    uVar4 = ref_node_local(ref_node,0,&local_98);
    if (uVar4 != 0) {
      uVar10 = (ulong)uVar4;
      pcVar16 = "loc";
      uVar9 = 0x2cd;
      goto LAB_00123903;
    }
    uVar4 = ref_node_local(ref_node,3,&local_94);
    if (uVar4 != 0) {
      uVar10 = (ulong)uVar4;
      pcVar16 = "loc";
      uVar9 = 0x2ce;
      goto LAB_00123903;
    }
    uVar4 = ref_node_local(ref_node,4,&local_90);
    if (uVar4 != 0) {
      uVar10 = (ulong)uVar4;
      pcVar16 = "loc";
      uVar9 = 0x2cf;
      goto LAB_00123903;
    }
    uVar4 = ref_node_local(ref_node,1,&local_8c);
    if (uVar4 != 0) {
      uVar10 = (ulong)uVar4;
      pcVar16 = "loc";
      uVar9 = 0x2d0;
      goto LAB_00123903;
    }
    local_88 = 10;
    uVar4 = ref_cell_add(pRVar1->cell[6],&local_98,&local_9c);
    if (uVar4 != 0) {
      uVar10 = (ulong)uVar4;
      pcVar16 = "add quad";
      uVar9 = 0x2d2;
      goto LAB_00123903;
    }
    iVar6 = ref_mpi->n;
    iVar7 = ref_mpi->id;
    iVar11 = (iVar6 + 6) / iVar6;
    iVar5 = (int)(6 / (long)iVar6);
    iVar14 = iVar5 * iVar6;
    iVar17 = 7 - iVar14;
  }
  else {
    iVar11 = (iVar6 + 6) / iVar6;
    iVar8 = (int)(3 / (long)iVar11);
    iVar17 = 7 - iVar14;
    if (iVar17 <= iVar8) {
      iVar8 = (3 - iVar11 * iVar17) / iVar5 + iVar17;
    }
    if (iVar7 == iVar8) goto LAB_00123489;
    iVar8 = (int)(4 / (long)iVar11);
    if (iVar17 <= iVar8) {
      iVar8 = (4 - iVar11 * iVar17) / iVar5 + iVar17;
    }
    if (iVar7 == iVar8) goto LAB_00123489;
    iVar8 = 0;
    if (iVar11 + 1U < 3) {
      iVar8 = iVar11;
    }
    if (iVar17 <= iVar8) {
      iVar8 = (1 - iVar11 * iVar17) / iVar5 + iVar17;
    }
    if (iVar7 == iVar8) goto LAB_00123489;
  }
  iVar8 = (int)(3 / (long)iVar11);
  if (iVar17 <= iVar8) {
    iVar8 = (3 - iVar17 * iVar11) / iVar5 + iVar17;
  }
  if (iVar7 == iVar8) {
LAB_0012366b:
    uVar4 = ref_node_local(ref_node,3,&local_98);
    if (uVar4 != 0) {
      uVar10 = (ulong)uVar4;
      pcVar16 = "loc";
      uVar9 = 0x2df;
      goto LAB_00123903;
    }
    uVar4 = ref_node_local(ref_node,5,&local_94);
    if (uVar4 != 0) {
      uVar10 = (ulong)uVar4;
      pcVar16 = "loc";
      uVar9 = 0x2e0;
      goto LAB_00123903;
    }
    uVar4 = ref_node_local(ref_node,4,&local_90);
    if (uVar4 != 0) {
      uVar10 = (ulong)uVar4;
      pcVar16 = "loc";
      uVar9 = 0x2e1;
      goto LAB_00123903;
    }
    local_8c = 100;
    uVar4 = ref_cell_add(pRVar1->cell[3],&local_98,&local_9c);
    if (uVar4 != 0) {
      uVar10 = (ulong)uVar4;
      pcVar16 = "add tri";
      uVar9 = 0x2e3;
      goto LAB_00123903;
    }
    iVar6 = ref_mpi->n;
    iVar7 = ref_mpi->id;
    iVar5 = (int)(6 / (long)iVar6);
    iVar14 = iVar5 * iVar6;
  }
  else {
    iVar8 = (int)(5 / (long)iVar11);
    if (iVar17 <= iVar8) {
      iVar8 = (5 - iVar17 * iVar11) / iVar5 + iVar17;
    }
    if (iVar7 == iVar8) goto LAB_0012366b;
    iVar8 = (int)(4 / (long)iVar11);
    if (iVar17 <= iVar8) {
      iVar8 = (4 - iVar11 * iVar17) / iVar5 + iVar17;
    }
    if (iVar7 == iVar8) goto LAB_0012366b;
  }
  iVar11 = 0;
  if (6 < iVar14) {
    iVar11 = ((((iVar6 + 6) / iVar6) * (iVar14 + -7)) / iVar5 - iVar14) + 7;
  }
  if (iVar7 != iVar11) {
    iVar6 = (iVar6 + 6) / iVar6;
    iVar11 = 0;
    if (iVar6 + 1U < 3) {
      iVar11 = iVar6;
    }
    iVar14 = 7 - iVar14;
    if (iVar14 <= iVar11) {
      iVar11 = (1 - iVar6 * iVar14) / iVar5 + iVar14;
    }
    if (iVar7 != iVar11) {
      iVar11 = (int)(2 / (long)iVar6);
      if (iVar14 <= iVar11) {
        iVar11 = (2 - iVar6 * iVar14) / iVar5 + iVar14;
      }
      if (iVar7 != iVar11) {
        return 0;
      }
    }
  }
  uVar4 = ref_node_local(ref_node,0,&local_98);
  if (uVar4 == 0) {
    uVar4 = ref_node_local(ref_node,1,&local_94);
    if (uVar4 == 0) {
      uVar4 = ref_node_local(ref_node,2,&local_90);
      if (uVar4 == 0) {
        local_8c = 0x65;
        uVar4 = ref_cell_add(pRVar1->cell[3],&local_98,&local_9c);
        if (uVar4 == 0) {
          return 0;
        }
        uVar10 = (ulong)uVar4;
        pcVar16 = "add tri";
        uVar9 = 0x2f4;
      }
      else {
        uVar10 = (ulong)uVar4;
        pcVar16 = "loc";
        uVar9 = 0x2f2;
      }
    }
    else {
      uVar10 = (ulong)uVar4;
      pcVar16 = "loc";
      uVar9 = 0x2f1;
    }
  }
  else {
    uVar10 = (ulong)uVar4;
    pcVar16 = "loc";
    uVar9 = 0x2f0;
  }
LAB_00123903:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar9,
         "ref_fixture_pri_tet_cap_grid",uVar10,pcVar16);
  return (REF_STATUS)uVar10;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_pri_tet_cap_grid(REF_GRID *ref_grid_ptr,
                                                REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 7;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;
  global[4] = 4;
  global[5] = 5;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[4]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[5])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0, 0.0, 0.0);
    add_that_node(2, 0.0, 1.0, 0.0);
    add_that_node(3, 0.0, 0.0, 1.0);
    add_that_node(4, 1.0, 0.0, 1.0);
    add_that_node(5, 0.0, 1.0, 1.0);

    RSS(ref_cell_add(ref_grid_pri(ref_grid), local, &cell), "add prism");
  }

  global[0] = 3;
  global[1] = 4;
  global[2] = 5;
  global[3] = 6;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 0.0, 1.0);
    add_that_node(1, 1.0, 0.0, 1.0);
    add_that_node(2, 0.0, 1.0, 1.0);
    add_that_node(3, 0.3, 0.3, 2.0);

    RSS(ref_cell_add(ref_grid_tet(ref_grid), local, &cell), "add prism");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  global[0] = 0;
  global[1] = 3;
  global[2] = 4;
  global[3] = 1;
  global[4] = 10;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    RSS(ref_node_local(ref_node, global[3], &(local[3])), "loc");
    local[4] = global[4];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), local, &cell), "add quad");
  }

  global[0] = 3;
  global[1] = 5;
  global[2] = 4;
  global[3] = 100;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    local[3] = global[3];
    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 101;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    local[3] = global[3];
    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  return REF_SUCCESS;
}